

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpudpv4transmitter.cpp
# Opt level: O1

void __thiscall
jrtplib::RTPUDPv4Transmitter::RTPUDPv4Transmitter(RTPUDPv4Transmitter *this,RTPMemoryManager *mgr)

{
  (this->super_RTPTransmitter).super_RTPMemoryObject.mgr = mgr;
  (this->super_RTPTransmitter).super_RTPMemoryObject._vptr_RTPMemoryObject =
       (_func_int **)&PTR__RTPMemoryObject_001441c0;
  timeinit = timeinit + 1;
  (this->super_RTPTransmitter).super_RTPMemoryObject._vptr_RTPMemoryObject =
       (_func_int **)&PTR__RTPUDPv4Transmitter_00144068;
  (this->localIPs).super__List_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)&this->localIPs;
  (this->localIPs).super__List_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)&this->localIPs;
  (this->localIPs).super__List_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl._M_node.
  _M_size = 0;
  (this->destinations).super_RTPMemoryObject.mgr = mgr;
  (this->destinations).super_RTPMemoryObject._vptr_RTPMemoryObject =
       (_func_int **)&PTR__RTPHashTable_001443a0;
  memset((this->destinations).table,0,0x103f8);
  (this->destinations).memorytype = 0xd;
  (this->multicastgroups).super_RTPMemoryObject.mgr = mgr;
  (this->multicastgroups).super_RTPMemoryObject._vptr_RTPMemoryObject =
       (_func_int **)&PTR__RTPHashTable_001443d8;
  memset((this->multicastgroups).table,0,0x103f8);
  (this->multicastgroups).memorytype = 0xe;
  (this->rawpacketlist).
  super__List_base<jrtplib::RTPRawPacket_*,_std::allocator<jrtplib::RTPRawPacket_*>_>._M_impl.
  _M_node.super__List_node_base._M_prev = (_List_node_base *)&this->rawpacketlist;
  (this->rawpacketlist).
  super__List_base<jrtplib::RTPRawPacket_*,_std::allocator<jrtplib::RTPRawPacket_*>_>._M_impl.
  _M_node.super__List_node_base._M_next = (_List_node_base *)&this->rawpacketlist;
  (this->rawpacketlist).
  super__List_base<jrtplib::RTPRawPacket_*,_std::allocator<jrtplib::RTPRawPacket_*>_>._M_impl.
  _M_node._M_size = 0;
  (this->acceptignoreinfo).super_RTPMemoryObject.mgr = mgr;
  (this->acceptignoreinfo).super_RTPMemoryObject._vptr_RTPMemoryObject =
       (_func_int **)&PTR__RTPKeyHashTable_00144410;
  memset((this->acceptignoreinfo).table,0,0x103f8);
  (this->acceptignoreinfo).memorytype = 0xb;
  RTPAbortDescriptors::RTPAbortDescriptors(&this->m_abortDesc);
  this->init = false;
  this->created = false;
  return;
}

Assistant:

RTPUDPv4Transmitter::RTPUDPv4Transmitter(RTPMemoryManager *mgr) : RTPTransmitter(mgr),destinations(mgr,RTPMEM_TYPE_CLASS_DESTINATIONLISTHASHELEMENT),
#ifdef RTP_SUPPORT_IPV4MULTICAST
								  multicastgroups(mgr,RTPMEM_TYPE_CLASS_MULTICASTHASHELEMENT),
#endif // RTP_SUPPORT_IPV4MULTICAST
								  acceptignoreinfo(mgr,RTPMEM_TYPE_CLASS_ACCEPTIGNOREHASHELEMENT)
{
	created = false;
	init = false;
}